

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_event_timer.h
# Opt level: O1

void ngx_event_del_timer(ngx_event_t *ev)

{
  if ((ev->log->log_level & 0x80) != 0) {
    ngx_log_error_core(8,ev->log,0,"event timer del: %d: %M",(ulong)*(uint *)((long)ev->data + 0x18)
                       ,(ev->timer).key);
  }
  ngx_rbtree_delete(&ngx_event_timer_rbtree,&ev->timer);
  (ev->timer).left = (ngx_rbtree_node_t *)0x0;
  (ev->timer).right = (ngx_rbtree_node_t *)0x0;
  (ev->timer).parent = (ngx_rbtree_node_t *)0x0;
  ev->field_0x9 = ev->field_0x9 & 0xf7;
  return;
}

Assistant:

static ngx_inline void
ngx_event_del_timer(ngx_event_t *ev)
{
    ngx_log_debug2(NGX_LOG_DEBUG_EVENT, ev->log, 0,
                   "event timer del: %d: %M",
                    ngx_event_ident(ev->data), ev->timer.key);

    ngx_rbtree_delete(&ngx_event_timer_rbtree, &ev->timer);

#if (NGX_DEBUG)
    ev->timer.left = NULL;
    ev->timer.right = NULL;
    ev->timer.parent = NULL;
#endif

    ev->timer_set = 0;
}